

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.hpp
# Opt level: O0

void __thiscall csv::CSVReader::initial_read(CSVReader *this)

{
  CSVReader *local_30;
  code *local_28;
  undefined8 local_20;
  thread local_18;
  CSVReader *local_10;
  CSVReader *this_local;
  
  local_28 = read_csv;
  local_20 = 0;
  local_30 = this;
  local_10 = this;
  std::thread::
  thread<bool(csv::CSVReader::*)(unsigned_long),csv::CSVReader*,unsigned_long_const&,void>
            (&local_18,(type *)&local_28,&local_30,&internals::ITERATION_CHUNK_SIZE);
  std::thread::operator=(&this->read_csv_worker,&local_18);
  std::thread::~thread(&local_18);
  std::thread::join();
  return;
}

Assistant:

void initial_read() {
            this->read_csv_worker = std::thread(&CSVReader::read_csv, this, internals::ITERATION_CHUNK_SIZE);
            this->read_csv_worker.join();
        }